

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int do_sign(EVP_PKEY *key,ptls_buffer_t *outbuf,ptls_iovec_t input,EVP_MD *md)

{
  int iVar1;
  int iVar2;
  EVP_MD_CTX *ctx;
  EVP_MD *pEVar3;
  size_t siglen;
  EVP_PKEY_CTX *pkey_ctx;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    return 0x201;
  }
  iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)&pkey_ctx,(EVP_MD *)md,(ENGINE *)0x0,
                             (EVP_PKEY *)key);
  iVar2 = 0x203;
  if (iVar1 != 1) goto LAB_001238de;
  iVar1 = EVP_PKEY_get_id(key);
  if (iVar1 == 6) {
    iVar1 = EVP_PKEY_CTX_set_rsa_padding(pkey_ctx,6);
    if ((iVar1 != 1) ||
       (iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx,0xffffffffffffffff), iVar1 != 1))
    goto LAB_001238de;
    pEVar3 = EVP_sha256();
    iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx,pEVar3);
    if (iVar1 != 1) goto LAB_001238de;
  }
  iVar1 = EVP_DigestSignUpdate(ctx,input.base,input.len);
  if ((iVar1 == 1) && (iVar1 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&siglen), iVar1 == 1)) {
    msg("reserving %ld bytes",siglen);
    iVar2 = ptls_buffer_reserve(outbuf,siglen);
    if (iVar2 == 0) {
      iVar1 = EVP_DigestSignFinal(ctx,outbuf->base + outbuf->off,&siglen);
      iVar2 = 0x203;
      if (iVar1 == 1) {
        outbuf->off = outbuf->off + siglen;
        iVar2 = 0;
      }
    }
  }
LAB_001238de:
  EVP_MD_CTX_free(ctx);
  return iVar2;
}

Assistant:

static int do_sign(EVP_PKEY *key, ptls_buffer_t *outbuf, ptls_iovec_t input, const EVP_MD *md)
{
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx;
    size_t siglen;
    int ret;

    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_DigestSignInit(ctx, &pkey_ctx, md, NULL, key) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
        if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, EVP_sha256()) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    }
    if (EVP_DigestSignUpdate(ctx, input.base, input.len) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_DigestSignFinal(ctx, NULL, &siglen) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    msg("reserving %ld bytes", siglen);
    if ((ret = ptls_buffer_reserve(outbuf, siglen)) != 0)
        goto Exit;
    if (EVP_DigestSignFinal(ctx, outbuf->base + outbuf->off, &siglen) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    outbuf->off += siglen;

    ret = 0;
Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    return ret;
}